

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * Pathie::Path::global_runtime_dir(Path *__return_storage_ptr__,localpathtype local)

{
  bool bVar1;
  localpathtype lVar2;
  allocator local_b9;
  string local_b8 [32];
  undefined4 local_98;
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [8];
  Path run;
  allocator local_39;
  string local_38 [36];
  localpathtype local_14;
  Path *pPStack_10;
  localpathtype local_local;
  
  local_14 = local;
  pPStack_10 = __return_storage_ptr__;
  if (local == LOCALPATH_LOCAL) {
LAB_00114981:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"/var/local/run",&local_39);
    Path(__return_storage_ptr__,(string *)local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    if (local == LOCALPATH_DEFAULT) {
      lVar2 = get_global_dir_default();
      if (lVar2 == LOCALPATH_LOCAL) goto LAB_00114981;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"/run",&local_91);
    Path((Path *)local_70,(string *)local_90);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    bVar1 = exists((Path *)local_70);
    if (bVar1) {
      Path(__return_storage_ptr__,(Path *)local_70);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,"/var/run",&local_b9);
      Path(__return_storage_ptr__,(string *)local_b8);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    }
    local_98 = 1;
    ~Path((Path *)local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::global_runtime_dir(localpathtype local)
{
#if defined(_PATHIE_UNIX)
  if (local == Path::LOCALPATH_LOCAL || (local == Path::LOCALPATH_DEFAULT && get_global_dir_default() == Path::LOCALPATH_LOCAL))
    return Path("/var/local/run");

  Path run("/run");
  if (run.exists())
    return run;
  else
    return Path("/var/run");
#elif defined(_WIN32)
  return Path("C:/Temp");
#else
#error Unsupported system.
#endif
}